

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O2

int mg::fs::MappedFile::open(char *__file,int __oflag,...)

{
  int __fd;
  size_t __len;
  __off_t _Var1;
  void *pvVar2;
  undefined8 *puVar3;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_rschlaikjer[P]mangetsu_src_util_fs_cpp:21:41),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_58;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_rschlaikjer[P]mangetsu_src_util_fs_cpp:21:41),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
  local_31 [8];
  __allocator_type __a2;
  
  __fd = ::open(___oflag,0);
  if (__fd < 0) {
    __file[0] = '\0';
    __file[1] = '\0';
    __file[2] = '\0';
    __file[3] = '\0';
    __file[4] = '\0';
    __file[5] = '\0';
    __file[6] = '\0';
    __file[7] = '\0';
  }
  else {
    local_48 = 0;
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_58._M_alloc = local_31;
    (local_40._M_pi)->_M_use_count = 1;
    (local_40._M_pi)->_M_weak_count = 1;
    (local_40._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0011fc78;
    *(int *)&local_40._M_pi[1]._vptr__Sp_counted_base = __fd;
    local_40._M_pi[1]._M_use_count = 0;
    local_40._M_pi[1]._M_weak_count = 0;
    local_58._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/rschlaikjer[P]mangetsu/src/util/fs.cpp:21:41),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_58);
    puVar3 = (undefined8 *)0x0;
    __len = lseek(__fd,0,2);
    if (-1 < (long)__len) {
      puVar3 = (undefined8 *)0x0;
      _Var1 = lseek(__fd,0,0);
      if (-1 < _Var1) {
        puVar3 = (undefined8 *)0x0;
        pvVar2 = mmap((void *)0x0,__len,1,2,__fd,0);
        if (pvVar2 != (void *)0x0) {
          puVar3 = (undefined8 *)operator_new(0x10);
          *puVar3 = pvVar2;
          puVar3[1] = __len;
        }
      }
    }
    *(undefined8 **)__file = puVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  }
  return (int)__file;
}

Assistant:

std::unique_ptr<MappedFile> MappedFile::open(const char *filename) {
  int file_fd = ::open(filename, O_RDONLY);
  if (file_fd < 0) {
    return nullptr;
  }

  std::shared_ptr<void> _defer_close_fd(nullptr,
                                        [=](...) { ::close(file_fd); });

  const off_t file_size = ::lseek(file_fd, 0, SEEK_END);
  if (file_size < 0) {
    return nullptr;
  }
  if (lseek(file_fd, 0, SEEK_SET) < 0) {
    return nullptr;
  }

  void *mmapped_data =
      mmap(nullptr, file_size, PROT_READ, MAP_PRIVATE, file_fd, 0);

  if (mmapped_data == nullptr) {
    return nullptr;
  }

  return std::unique_ptr<MappedFile>(
      new MappedFile(reinterpret_cast<uint8_t *>(mmapped_data), file_size));
}